

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  byte bVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  stbi__uint32 sVar8;
  stbi__uint32 sVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  size_t sVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ushort uVar22;
  long lVar23;
  byte bVar24;
  stbi_uc *psVar25;
  uint uVar26;
  int iVar27;
  uint y;
  uint uVar28;
  long lVar29;
  bool bVar30;
  stbi_uc asStack_4d8 [8];
  stbi_uc palette [1024];
  stbi__uint32 local_b4;
  int local_b0;
  stbi__uint32 raw_len;
  stbi_uc *local_a8;
  ulong local_a0;
  uint local_94;
  stbi__uint32 local_90;
  uint local_8c;
  undefined8 local_88;
  short local_7e [3];
  undefined4 uStack_78;
  stbi__uint16 tc16 [3];
  stbi_uc local_34 [8];
  stbi_uc tc [3];
  
  local_34[0] = '\0';
  local_34[1] = '\0';
  local_34[2] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar7 = stbi__check_png_header(s);
  if (iVar7 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar30 = true;
  _uStack_78 = (stbi_uc *)((ulong)(uint)tc16._2_4_ << 0x20);
  local_a0 = 0;
  bVar3 = false;
  uVar11 = 0;
  uVar10 = 0;
  uVar28 = 0;
  local_88 = 0;
  bVar24 = 0;
  local_94 = req_comp;
  do {
    sVar8 = stbi__get32be(s);
    sVar9 = stbi__get32be(s);
    if (sVar9 == 0x43674249) {
      stbi__skip(s,sVar8);
      bVar3 = true;
    }
    else if (sVar9 == 0x49444154) {
      if (bVar30) goto LAB_00120ef1;
      if ((bVar24 != 0) && (uVar11 == 0)) {
        stbi__g_failure_reason = "no PLTE";
        return 0;
      }
      if (scan == 2) {
        s->img_n = (uint)bVar24;
        return 1;
      }
      uVar16 = uVar28 + sVar8;
      if ((int)uVar16 < (int)uVar28) {
        return 0;
      }
      if (uVar10 < uVar16) {
        uVar18 = 0x1000;
        if (0x1000 < sVar8) {
          uVar18 = (ulong)sVar8;
        }
        if (uVar10 != 0) {
          uVar18 = (ulong)uVar10;
        }
        do {
          sVar15 = uVar18;
          uVar10 = (uint)sVar15;
          uVar18 = (ulong)(uVar10 * 2);
        } while (uVar10 < uVar16);
        psVar14 = (stbi_uc *)realloc(*ppsVar1,sVar15);
        if (psVar14 == (stbi_uc *)0x0) goto LAB_00121591;
        *ppsVar1 = psVar14;
      }
      else {
        psVar14 = *ppsVar1;
      }
      psVar14 = psVar14 + uVar28;
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
        psVar25 = s->img_buffer;
        psVar13 = s->img_buffer_end;
LAB_00120e04:
        sVar15 = (size_t)(int)sVar8;
        if (psVar13 < psVar25 + sVar15) {
LAB_00120f65:
          stbi__g_failure_reason = "outofdata";
          return 0;
        }
        memcpy(psVar14,psVar25,sVar15);
        s->img_buffer = s->img_buffer + sVar15;
      }
      else {
        psVar25 = s->img_buffer;
        psVar13 = s->img_buffer_end;
        iVar7 = (int)psVar13 - (int)psVar25;
        iVar27 = sVar8 - iVar7;
        if (iVar27 == 0 || (int)sVar8 < iVar7) goto LAB_00120e04;
        memcpy(psVar14,psVar25,(long)iVar7);
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)(psVar14 + iVar7),iVar27);
        s->img_buffer = s->img_buffer_end;
        if (iVar7 != iVar27) goto LAB_00120f65;
      }
      bVar30 = false;
      uVar28 = uVar16;
    }
    else if (sVar9 == 0x49484452) {
      if (!bVar30) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (sVar8 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      sVar8 = stbi__get32be(s);
      s->img_x = sVar8;
      if (0x1000000 < sVar8) {
LAB_00120ec4:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      sVar8 = stbi__get32be(s);
      s->img_y = sVar8;
      if (0x1000000 < sVar8) goto LAB_00120ec4;
      bVar4 = stbi__get8(s);
      z->depth = (uint)bVar4;
      if ((0x10 < bVar4) || ((0x10116U >> (bVar4 & 0x1f) & 1) == 0)) {
        stbi__g_failure_reason = "1/2/4/8/16-bit only";
        return 0;
      }
      bVar4 = stbi__get8(s);
      if (6 < bVar4) {
LAB_00120ed6:
        stbi__g_failure_reason = "bad ctype";
        return 0;
      }
      local_a0 = (ulong)bVar4;
      if (bVar4 == 3) {
        bVar24 = 3;
        if (z->depth == 0x10) goto LAB_00120ed6;
      }
      else if ((bVar4 & 1) != 0) goto LAB_00120ed6;
      sVar5 = stbi__get8(s);
      if (sVar5 != '\0') {
        stbi__g_failure_reason = "bad comp method";
        return 0;
      }
      sVar5 = stbi__get8(s);
      if (sVar5 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar6 = stbi__get8(s);
      if (1 < bVar6) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar16 = s->img_x;
      if ((uVar16 == 0) || (uVar21 = s->img_y, uVar21 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      _uStack_78 = (stbi_uc *)CONCAT44(tc16._2_4_,(uint)bVar6);
      if (bVar24 == 0) {
        uVar26 = (uint)(3 < bVar4) + ((uint)local_a0 & 2) + 1;
        s->img_n = uVar26;
        if ((uint)((0x40000000 / (ulong)uVar16) / (ulong)uVar26) < uVar21) goto LAB_00120ec4;
        bVar30 = false;
        bVar24 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar30 = false;
        if ((uint)(0x40000000 / (ulong)uVar16 >> 2) < uVar21) goto LAB_00120ec4;
      }
    }
    else if (sVar9 == 0x504c5445) {
      if (bVar30) goto LAB_00120ef1;
      if ((0x300 < sVar8) || (uVar11 = (sVar8 & 0xffff) / 3, uVar11 * 3 != sVar8)) {
        stbi__g_failure_reason = "invalid PLTE";
        return 0;
      }
      for (uVar18 = 0; uVar11 != uVar18; uVar18 = uVar18 + 1) {
        sVar5 = stbi__get8(s);
        asStack_4d8[uVar18 * 4] = sVar5;
        sVar5 = stbi__get8(s);
        asStack_4d8[uVar18 * 4 + 1] = sVar5;
        sVar5 = stbi__get8(s);
        asStack_4d8[uVar18 * 4 + 2] = sVar5;
        asStack_4d8[uVar18 * 4 + 3] = 0xff;
      }
      bVar30 = false;
    }
    else {
      if (sVar9 == 0x74524e53) {
        if (bVar30) goto LAB_00120ef1;
        if (*ppsVar1 != (stbi_uc *)0x0) {
          stbi__g_failure_reason = "tRNS after IDAT";
          return 0;
        }
        if (bVar24 == 0) {
          uVar16 = s->img_n;
          if ((uVar16 & 1) == 0) {
            stbi__g_failure_reason = "tRNS with alpha";
            return 0;
          }
          if (uVar16 * 2 != sVar8) goto LAB_00120f5c;
          if (z->depth == 0x10) {
            for (lVar23 = 0; lVar20 = (long)(int)uVar16, lVar23 < lVar20; lVar23 = lVar23 + 1) {
              iVar7 = stbi__get16be(s);
              local_7e[lVar23] = (short)iVar7;
              uVar16 = s->img_n;
            }
          }
          else {
            for (lVar23 = 0; lVar20 = (long)(int)uVar16, lVar23 < lVar20; lVar23 = lVar23 + 1) {
              iVar7 = stbi__get16be(s);
              local_34[lVar23] = ""[z->depth] * (char)iVar7;
              uVar16 = s->img_n;
            }
          }
          local_88 = CONCAT71((int7)((ulong)lVar20 >> 8),1);
          bVar30 = false;
          bVar24 = 0;
          goto LAB_00120eb7;
        }
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar11 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (uVar11 < sVar8) {
LAB_00120f5c:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        for (uVar18 = 0; sVar8 != uVar18; uVar18 = uVar18 + 1) {
          sVar5 = stbi__get8(s);
          asStack_4d8[uVar18 * 4 + 3] = sVar5;
        }
        bVar24 = 4;
      }
      else {
        if (sVar9 == 0x49454e44) {
          if (bVar30) {
LAB_00120ef1:
            stbi__g_failure_reason = "first not IHDR";
            return 0;
          }
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 == (stbi_uc *)0x0) {
            stbi__g_failure_reason = "no IDAT";
            return 0;
          }
          local_b4 = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
          psVar14 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*ppsVar1,uVar28,local_b4,(int *)&local_b4,(uint)!bVar3);
          z->expanded = psVar14;
          if (psVar14 == (stbi_uc *)0x0) {
            return 0;
          }
          free(z->idata);
          z->idata = (stbi_uc *)0x0;
          uVar11 = s->img_n + 1;
          uVar28 = s->img_n;
          if ((char)local_88 != '\0') {
            uVar28 = uVar11;
          }
          local_8c = uVar28;
          if (local_94 != 3) {
            local_8c = uVar11;
          }
          if (bVar24 != 0) {
            local_8c = uVar28;
          }
          if (uVar11 != local_94) {
            local_8c = uVar28;
          }
          s->img_out_n = local_8c;
          psVar14 = z->expanded;
          iVar7 = z->depth;
          iVar27 = local_8c << (iVar7 == 0x10);
          sVar8 = z->s->img_x;
          sVar9 = z->s->img_y;
          if (uStack_78 == 0) {
            iVar7 = stbi__create_png_image_raw
                              (z,psVar14,local_b4,local_8c,sVar8,sVar9,iVar7,(int)local_a0);
            if (iVar7 == 0) {
              return 0;
            }
          }
          else {
            local_90 = local_b4;
            local_a8 = (stbi_uc *)stbi__malloc_mad3(sVar8,sVar9,iVar27,0);
            sVar15 = (size_t)iVar27;
            for (lVar23 = 0; lVar23 != 7; lVar23 = lVar23 + 1) {
              psVar2 = z->s;
              _uStack_78 = (stbi_uc *)(long)(int)(&DAT_0013ae30)[lVar23];
              uVar11 = (&DAT_0013ae70)[lVar23];
              uVar21 = ~(&DAT_0013ae30)[lVar23] + psVar2->img_x + uVar11;
              uVar26 = uVar21 / uVar11;
              uVar28 = (&DAT_0013ae50)[lVar23];
              uVar10 = (&DAT_0013ae90)[lVar23];
              uVar16 = ~uVar28 + psVar2->img_y + uVar10;
              y = uVar16 / uVar10;
              if ((uVar11 <= uVar21) && (uVar10 <= uVar16)) {
                iVar17 = psVar2->img_n;
                iVar12 = stbi__create_png_image_raw
                                   (z,psVar14,local_90,local_8c,uVar26,y,iVar7,(int)local_a0);
                if (iVar12 == 0) {
                  free(local_a8);
                  return 0;
                }
                raw_len = (((int)(uVar26 * iVar7 * iVar17 + 7) >> 3) + 1) * y;
                palette._1016_8_ = SEXT48((int)y);
                iVar17 = uVar28 * iVar27;
                local_b0 = uVar10 * iVar27;
                _uStack_78 = local_a8 + (long)_uStack_78 * sVar15;
                for (lVar20 = 0; lVar20 < (long)palette._1016_8_; lVar20 = lVar20 + 1) {
                  psVar25 = _uStack_78;
                  for (lVar29 = 0; lVar29 < (int)uVar26; lVar29 = lVar29 + 1) {
                    memcpy(psVar25 + z->s->img_x * iVar17,
                           z->out + (lVar29 + lVar20 * (int)uVar26) * sVar15,sVar15);
                    psVar25 = psVar25 + (long)(int)uVar11 * sVar15;
                  }
                  iVar17 = iVar17 + local_b0;
                }
                free(z->out);
                psVar14 = psVar14 + raw_len;
                local_90 = local_90 - raw_len;
              }
            }
            z->out = local_a8;
          }
          if ((char)local_88 != '\0') {
            psVar14 = z->out;
            iVar27 = z->s->img_y * z->s->img_x;
            iVar7 = s->img_out_n;
            if (z->depth == 0x10) {
              if (iVar7 == 4) {
                for (lVar23 = 0; iVar27 != (int)lVar23; lVar23 = lVar23 + 1) {
                  if (((*(short *)(psVar14 + lVar23 * 8) == local_7e[0]) &&
                      (*(short *)(psVar14 + lVar23 * 8 + 2) == local_7e[1])) &&
                     (*(short *)(psVar14 + lVar23 * 8 + 4) == local_7e[2])) {
                    (psVar14 + lVar23 * 8 + 6)[0] = '\0';
                    (psVar14 + lVar23 * 8 + 6)[1] = '\0';
                  }
                }
              }
              else {
                if (iVar7 != 2) {
                  __assert_fail("out_n == 2 || out_n == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                                ,0x124e,
                                "int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                               );
                }
                for (lVar23 = 0; iVar27 != (int)lVar23; lVar23 = lVar23 + 1) {
                  *(ushort *)(psVar14 + lVar23 * 4 + 2) =
                       -(ushort)(*(short *)(psVar14 + lVar23 * 4) != local_7e[0]);
                }
              }
            }
            else if (iVar7 == 4) {
              for (lVar23 = 0; iVar27 != (int)lVar23; lVar23 = lVar23 + 1) {
                if (((psVar14[lVar23 * 4] == local_34[0]) &&
                    (psVar14[lVar23 * 4 + 1] == local_34[1])) &&
                   (psVar14[lVar23 * 4 + 2] == local_34[2])) {
                  psVar14[lVar23 * 4 + 3] = '\0';
                }
              }
            }
            else {
              if (iVar7 != 2) {
                __assert_fail("out_n == 2 || out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                              ,0x1235,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)")
                ;
              }
              for (lVar23 = 0; iVar27 != (int)lVar23; lVar23 = lVar23 + 1) {
                psVar14[lVar23 * 2 + 1] = -(psVar14[lVar23 * 2] != local_34[0]);
              }
            }
          }
          if (((bVar3) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            psVar2 = z->s;
            psVar14 = z->out;
            iVar7 = psVar2->img_y * psVar2->img_x;
            if (psVar2->img_out_n == 4) {
              if (stbi__unpremultiply_on_load == 0) {
                for (lVar23 = 0; iVar7 != (int)lVar23; lVar23 = lVar23 + 1) {
                  sVar5 = psVar14[lVar23 * 4];
                  psVar14[lVar23 * 4] = psVar14[lVar23 * 4 + 2];
                  psVar14[lVar23 * 4 + 2] = sVar5;
                }
              }
              else {
                for (lVar23 = 0; iVar7 != (int)lVar23; lVar23 = lVar23 + 1) {
                  bVar4 = psVar14[lVar23 * 4 + 3];
                  bVar6 = psVar14[lVar23 * 4];
                  if (bVar4 == 0) {
                    psVar14[lVar23 * 4] = psVar14[lVar23 * 4 + 2];
                    psVar14[lVar23 * 4 + 2] = bVar6;
                  }
                  else {
                    uVar11 = (uint)(bVar4 >> 1);
                    uVar22 = (ushort)bVar4;
                    psVar14[lVar23 * 4] =
                         (stbi_uc)(((uint)psVar14[lVar23 * 4 + 2] * 0xff + uVar11 & 0xffff) /
                                  (uint)uVar22);
                    psVar14[lVar23 * 4 + 1] =
                         (stbi_uc)(((uint)psVar14[lVar23 * 4 + 1] * 0xff + uVar11 & 0xffff) /
                                  (uint)uVar22);
                    psVar14[lVar23 * 4 + 2] =
                         (stbi_uc)(((uint)bVar6 * 0xff + uVar11 & 0xffff) / (uint)uVar22);
                  }
                }
              }
            }
            else {
              if (psVar2->img_out_n != 3) {
                __assert_fail("s->img_out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                              ,0x129f,"void stbi__de_iphone(stbi__png *)");
              }
              while (bVar30 = iVar7 != 0, iVar7 = iVar7 + -1, bVar30) {
                sVar5 = *psVar14;
                *psVar14 = psVar14[2];
                psVar14[2] = sVar5;
                psVar14 = psVar14 + 3;
              }
            }
          }
          if (bVar24 == 0) {
            if ((char)local_88 != '\0') {
              s->img_n = s->img_n + 1;
            }
          }
          else {
            s->img_n = (uint)bVar24;
            uVar11 = (uint)bVar24;
            if (2 < (int)local_94) {
              uVar11 = local_94;
            }
            s->img_out_n = uVar11;
            psVar14 = z->out;
            uVar28 = z->s->img_y * z->s->img_x;
            psVar25 = (stbi_uc *)stbi__malloc_mad2(uVar28,uVar11,0);
            if (psVar25 == (stbi_uc *)0x0) {
LAB_00121591:
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            uVar18 = 0;
            psVar13 = psVar25;
            if (uVar11 == 3) {
              for (; uVar28 != uVar18; uVar18 = uVar18 + 1) {
                uVar19 = (ulong)psVar14[uVar18];
                *psVar13 = asStack_4d8[uVar19 * 4];
                psVar13[1] = asStack_4d8[uVar19 * 4 + 1];
                psVar13[2] = asStack_4d8[uVar19 * 4 + 2];
                psVar13 = psVar13 + 3;
              }
            }
            else {
              for (; uVar28 != uVar18; uVar18 = uVar18 + 1) {
                uVar19 = (ulong)psVar14[uVar18];
                psVar25[uVar18 * 4] = asStack_4d8[uVar19 * 4];
                psVar25[uVar18 * 4 + 1] = asStack_4d8[uVar19 * 4 + 1];
                psVar25[uVar18 * 4 + 2] = asStack_4d8[uVar19 * 4 + 2];
                psVar25[uVar18 * 4 + 3] = asStack_4d8[uVar19 * 4 + 3];
              }
            }
            free(psVar14);
            z->out = psVar25;
          }
          free(z->expanded);
          z->expanded = (stbi_uc *)0x0;
          return 1;
        }
        if (bVar30) goto LAB_00120ef1;
        if ((sVar9 >> 0x1d & 1) == 0) {
          uVar11 = sVar9 >> 0x18 | (sVar9 & 0xff0000) >> 8 | (sVar9 & 0xff00) << 8 | sVar9 << 0x18;
          stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
          stbi__parse_png_file::invalid_chunk[0] = (char)uVar11;
          stbi__parse_png_file::invalid_chunk[1] = (char)(uVar11 >> 8);
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar11 >> 0x10);
          stbi__parse_png_file::invalid_chunk[3] = (char)(uVar11 >> 0x18);
          return 0;
        }
        stbi__skip(s,sVar8);
      }
      bVar30 = false;
    }
LAB_00120eb7:
    stbi__get32be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}